

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_adaptive_code.hpp
# Opt level: O0

void __thiscall
LDPC4QKD::RateAdaptiveCode<unsigned_int>::encode_at_current_rate<bool,bool>
          (RateAdaptiveCode<unsigned_int> *this,vector<bool,_std::allocator<bool>_> *in,
          vector<bool,_std::allocator<bool>_> *out)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  bool bVar1;
  const_reference cVar2;
  size_type sVar3;
  ostream *this_01;
  value_type *pvVar4;
  const_reference this_02;
  undefined1 rhs;
  _Bit_reference lhs;
  reference local_70;
  reference local_60;
  uint *local_50;
  uint *var_node;
  const_iterator __end0;
  const_iterator __begin0;
  value_type *__range4;
  size_t i;
  vector<bool,_std::allocator<bool>_> *local_20;
  vector<bool,_std::allocator<bool>_> *out_local;
  vector<bool,_std::allocator<bool>_> *in_local;
  RateAdaptiveCode<unsigned_int> *this_local;
  
  local_20 = out;
  out_local = in;
  in_local = (vector<bool,_std::allocator<bool>_> *)this;
  sVar3 = std::vector<bool,_std::allocator<bool>_>::size(in);
  this_00 = local_20;
  if (sVar3 == this->n_cols) {
    sVar3 = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::size(&this->pos_varn);
    i._7_1_ = 0;
    std::vector<bool,_std::allocator<bool>_>::assign(this_00,sVar3,(bool *)((long)&i + 7));
    __range4 = (value_type *)0x0;
    while( true ) {
      pvVar4 = (value_type *)
               std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::size(&this->pos_varn);
      if (pvVar4 <= __range4) break;
      this_02 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[](&this->pos_varn,(size_type)__range4);
      __end0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_02);
      var_node = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_02);
      while( true ) {
        rhs = SUB81(pvVar4,0);
        bVar1 = __gnu_cxx::
                operator==<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          (&__end0,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                    *)&var_node);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        local_50 = __gnu_cxx::
                   __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*(&__end0);
        local_60 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (local_20,(size_type)__range4);
        cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](out_local,(ulong)*local_50);
        lhs._M_mask._0_1_ = cVar2;
        lhs._M_p = (_Bit_type *)local_60._M_mask;
        lhs._M_mask._1_7_ = 0;
        bVar1 = xor_as_bools<std::_Bit_reference,bool>
                          ((RateAdaptiveCode<unsigned_int> *)local_60._M_p,lhs,(bool)rhs);
        local_70 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (local_20,(size_type)__range4);
        pvVar4 = (value_type *)local_70._M_p;
        std::_Bit_reference::operator=(&local_70,bVar1);
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end0);
      }
      __range4 = (value_type *)
                 ((long)&(__range4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                         ._M_impl.super__Vector_impl_data._M_start + 1);
    }
  }
  else {
    this_01 = std::operator<<((ostream *)&std::cerr,"Encoder received invalid input length.");
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

constexpr void encode_at_current_rate(
                const std::vector<BitL> &in, std::vector<BitR> &out) const {
            if (in.size() != n_cols) {
                LDPC4QKD_DEBUG_MESSAGE("Encoder received invalid input length.");  // TODO maybe use exception?
                return;
            }

            out.assign(pos_varn.size(), 0);

            for (std::size_t i{}; i < pos_varn.size(); ++i) {
                for (auto &var_node: pos_varn[i]) {
                    out[i] = xor_as_bools(out[i], in[var_node]);
                }
            }
        }